

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp_sample.c
# Opt level: O0

void test_http_post(void)

{
  HTTP_CLIENT_RESULT HVar1;
  HTTP_CLIENT_HANDLE handle;
  HTTP_HEADERS_HANDLE httpHeadersHandle;
  size_t content_len;
  size_t len;
  char *post_data;
  HTTP_HEADERS_HANDLE http_headers;
  HTTP_CLIENT_HANDLE http_handle;
  HTTP_SAMPLE_INFO sample_info;
  int port_num;
  char *host_name;
  
  _sample_info = "httpbin.org";
  http_handle._4_4_ = 0x50;
  http_handle._0_4_ = 0;
  handle = create_uhttp_client_handle((HTTP_SAMPLE_INFO *)&http_handle,"httpbin.org",0x50);
  if (handle == (HTTP_CLIENT_HANDLE)0x0) {
    printf("FAILED MORE HERE\r\n");
  }
  else {
    uhttp_client_set_trace(handle,true,true);
    HVar1 = uhttp_client_open(handle,_sample_info,http_handle._4_4_,on_http_connected,&http_handle);
    if (HVar1 == HTTP_CLIENT_OK) {
      httpHeadersHandle = HTTPHeaders_Alloc();
      if (httpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
        printf("http alloc failed\r\n");
      }
      else {
        HTTPHeaders_AddHeaderNameValuePair(httpHeadersHandle,"User-Agent","uhttp/1.0");
        HTTPHeaders_AddHeaderNameValuePair(httpHeadersHandle,"Content-Type","application/json");
        content_len = strlen(
                            "{ \"encryptedData\": { \"authKey\": \"xxxxxxx\", \"secondaryAuthKey\": \"xxxxxxx\", nonce: \"blah\" }, correlationId: \"ASDDSA\"  }"
                            );
        HVar1 = uhttp_client_execute_request
                          (handle,HTTP_CLIENT_REQUEST_POST,"/post",httpHeadersHandle,
                           (uchar *)
                           "{ \"encryptedData\": { \"authKey\": \"xxxxxxx\", \"secondaryAuthKey\": \"xxxxxxx\", nonce: \"blah\" }, correlationId: \"ASDDSA\"  }"
                           ,content_len,on_http_recv,&http_handle);
        if (HVar1 == HTTP_CLIENT_OK) {
          do {
            uhttp_client_dowork(handle);
          } while ((int)http_handle == 0);
        }
        else {
          printf("FAILED FURTHER HERE\r\n");
        }
        HTTPHeaders_Free(httpHeadersHandle);
      }
      uhttp_client_close(handle,on_closed_callback,(void *)0x0);
    }
    else {
      printf("FAILED MORE HERE\r\n");
    }
    uhttp_client_destroy(handle);
  }
  return;
}

Assistant:

void test_http_post(void)
{
    const char* host_name = "httpbin.org";
    int port_num = HTTP_PORT_NUM;
    HTTP_SAMPLE_INFO sample_info;
    sample_info.stop_running = 0;

    HTTP_CLIENT_HANDLE http_handle = create_uhttp_client_handle(&sample_info, host_name, port_num);
    if (http_handle == NULL)
    {
        (void)printf("FAILED MORE HERE\r\n");
    }
    else
    {
        (void)uhttp_client_set_trace(http_handle, true, true);
        if (uhttp_client_open(http_handle, host_name, port_num, on_http_connected, &sample_info) != HTTP_CLIENT_OK)
        {
            (void)printf("FAILED MORE HERE\r\n");
        }
        else
        {
            HTTP_HEADERS_HANDLE http_headers = HTTPHeaders_Alloc();
            if (http_headers == NULL)
            {
                (void)printf("http alloc failed\r\n");
            }
            else
            {
                HTTPHeaders_AddHeaderNameValuePair(http_headers, "User-Agent", "uhttp/1.0");
                HTTPHeaders_AddHeaderNameValuePair(http_headers, "Content-Type", "application/json");

                const char* post_data = "{ \"encryptedData\": { \"authKey\": \"xxxxxxx\", \"secondaryAuthKey\": \"xxxxxxx\", nonce: \"blah\" }, correlationId: \"ASDDSA\"  }";
                size_t len = strlen(post_data);
                if (uhttp_client_execute_request(http_handle, HTTP_CLIENT_REQUEST_POST, "/post", http_headers, (const unsigned char*)post_data, len, on_http_recv, &sample_info) != HTTP_CLIENT_OK)
                {
                    (void)printf("FAILED FURTHER HERE\r\n");
                }
                else
                {
                    do
                    {
                        uhttp_client_dowork(http_handle);
                    } while (sample_info.stop_running == 0);
                }
                HTTPHeaders_Free(http_headers);
            }
            uhttp_client_close(http_handle, on_closed_callback, NULL);
        }
        uhttp_client_destroy(http_handle);
    }
}